

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

GridHandle<pbrt::NanoVDBBuffer> *
nanovdb::io::readGrid<pbrt::NanoVDBBuffer>
          (GridHandle<pbrt::NanoVDBBuffer> *__return_storage_ptr__,istream *is,string *gridName,
          NanoVDBBuffer *buffer)

{
  size_t sVar1;
  uint8_t *puVar2;
  uint64_t *puVar3;
  __type_conflict _Var4;
  int iVar5;
  uint64_t uVar6;
  ssize_t sVar7;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var8;
  runtime_error *prVar9;
  vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_> *__nbytes;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  uint64_t *puVar10;
  long lVar11;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> tmp;
  fileSize_t size;
  NanoVDBBuffer *local_80;
  uLongf numBytes;
  Segment local_70;
  NanoVDBBuffer local_48;
  
  local_80 = buffer;
  uVar6 = stringHash(gridName);
  __nbytes = &local_70.meta;
  local_70.header.magic = 0x304244566f6e614e;
  local_70.header.major = 0x13;
  local_70.header.minor = 0;
  local_70.header.gridCount = 0;
  local_70.header.codec = NONE;
  local_70.meta.
  super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 0;
  local_70.meta.
  super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>._M_impl.
  super__Vector_impl_data._M_start._2_6_ = 0;
  local_70.meta.
  super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>._M_impl.
  super__Vector_impl_data._M_finish._0_2_ = 0;
  local_70.meta.
  super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>._M_impl.
  super__Vector_impl_data._M_finish._2_6_ = 0;
  local_70.meta.
  super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __buf = extraout_RDX;
  do {
    sVar7 = Segment::read(&local_70,(int)is,__buf,(size_t)__nbytes);
    if ((char)sVar7 == '\0') {
      (__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase = (_func_int **)0x0;
      (__return_storage_ptr__->mBuffer).alloc.memoryResource = (memory_resource *)0x0;
      (__return_storage_ptr__->mBuffer).bytesAllocated = 0;
      (__return_storage_ptr__->mBuffer).ptr = (uint8_t *)0x0;
      GridHandle<pbrt::NanoVDBBuffer>::GridHandle(__return_storage_ptr__);
LAB_00363e4d:
      std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>::~vector
                (&local_70.meta);
      return __return_storage_ptr__;
    }
    puVar3 = (uint64_t *)
             CONCAT62(local_70.meta.
                      super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
                      ._M_impl.super__Vector_impl_data._M_finish._2_6_,
                      local_70.meta.
                      super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
                      ._M_impl.super__Vector_impl_data._M_finish._0_2_);
    lVar11 = 0;
    for (puVar10 = (uint64_t *)
                   CONCAT62(local_70.meta.
                            super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
                            ._M_impl.super__Vector_impl_data._M_start._2_6_,
                            local_70.meta.
                            super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_2_); puVar10 != puVar3;
        puVar10 = puVar10 + 0x16) {
      if (puVar10[2] == uVar6) {
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(puVar10 + 0x12),gridName);
        if (_Var4) {
          pbrt::NanoVDBBuffer::create(&local_48,*puVar10,local_80);
          GridHandle<pbrt::NanoVDBBuffer>::GridHandle(__return_storage_ptr__,&local_48);
          pbrt::NanoVDBBuffer::~NanoVDBBuffer(&local_48);
          std::istream::seekg((long)is,(_Ios_Seekdir)lVar11);
          sVar1 = (__return_storage_ptr__->mBuffer).bytesAllocated;
          puVar2 = (__return_storage_ptr__->mBuffer).ptr;
          if (local_70.header.codec == ZIP) {
            std::istream::read((char *)is,(long)&size);
            _Var8.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                 (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
                 operator_new__(size);
            tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
            _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                 (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
                 (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
                 _Var8.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                 _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                 .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
            std::istream::read((char *)is,
                               (long)_Var8.
                                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                     .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
            numBytes = sVar1;
            iVar5 = uncompress(puVar2,&numBytes,
                               _Var8.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,size);
            if (iVar5 != 0) {
              std::runtime_error::runtime_error
                        ((runtime_error *)&local_48,"Internal read error in ZIP");
              std::runtime_error::~runtime_error((runtime_error *)&local_48);
            }
            if (numBytes != sVar1) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar9,"UNZIP failed on byte size");
              __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                      (&tmp);
          }
          else {
            if (local_70.header.codec == BLOSC) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (prVar9,"BLOSC compression codec was disabled during build");
              goto LAB_00363eba;
            }
            std::istream::read((char *)is,(long)puVar2);
          }
          if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar9,"Failed to read Tree from file");
LAB_00363eba:
            __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00363e4d;
        }
      }
      lVar11 = lVar11 + puVar10[1];
    }
    std::istream::seekg((long)is,(_Ios_Seekdir)lVar11);
    __buf = extraout_RDX_00;
  } while( true );
}

Assistant:

GridHandle<BufferT> readGrid(std::istream& is, const std::string& gridName, const BufferT& buffer)
{
    const auto key = stringHash(gridName);
    Segment    s;
    while (s.read(is)) {
        std::streamoff seek = 0;
        for (auto& m : s.meta) {
            if (m.nameKey == key && m.gridName == gridName) { // check for hask key collision
                GridHandle<BufferT> handle(BufferT::create(m.gridSize, &buffer));
                is.seekg(seek, std::ios_base::cur); // rewind
                Internal::read(is, handle, s.header.codec);
                return handle;// is converted to r-value and return value is move constructed.
            } else {
                seek += m.fileSize;
            }
        }
        is.seekg(seek, std::ios_base::cur); // skip forward from the current position
    }
    return GridHandle<BufferT>();// empty handle
}